

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

void __thiscall
helics::TimeCoordinator::setOptionFlag(TimeCoordinator *this,int optionFlag,bool value)

{
  if (optionFlag < 0xb) {
    if (optionFlag == 1) {
      (this->info).uninterruptible = value;
      return;
    }
    if (optionFlag == 10) {
      (this->info).wait_for_current_time_updates = value;
      return;
    }
  }
  else if (optionFlag == 0xb) {
    (this->info).restrictive_time_policy = value;
  }
  else if (optionFlag == 0x51) {
    (this->info).event_triggered = value;
    return;
  }
  return;
}

Assistant:

void TimeCoordinator::setOptionFlag(int optionFlag, bool value)
{
    switch (optionFlag) {
        case defs::Flags::UNINTERRUPTIBLE:
            info.uninterruptible = value;
            break;
        case defs::Flags::WAIT_FOR_CURRENT_TIME_UPDATE:
            info.wait_for_current_time_updates = value;
            break;
        case defs::Flags::RESTRICTIVE_TIME_POLICY:
            info.restrictive_time_policy = value;
            break;
        case defs::Flags::EVENT_TRIGGERED:
            info.event_triggered = value;
            break;
        default:
            break;
    }
}